

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O0

void la_miam_file_segment_format_text(la_vstring *vstr,void *data,int indent)

{
  uint uVar1;
  char *pcVar2;
  int in_EDX;
  long in_RSI;
  la_vstring *in_RDI;
  la_miam_file_segment_msg *msg;
  
  uVar1 = in_EDX + 1;
  la_vstring_append_sprintf
            (in_RDI,"%*sFile ID: %u\n",(ulong)uVar1,"",(ulong)*(ushort *)(in_RSI + 8));
  la_vstring_append_sprintf
            (in_RDI,"%*sSegment ID: %u\n",(ulong)uVar1,"",(ulong)*(ushort *)(in_RSI + 10));
  pcVar2 = la_reasm_status_name_get(*(la_reasm_status *)(in_RSI + 0xc));
  la_vstring_append_sprintf(in_RDI,"%*sReassembly: %s\n",(ulong)uVar1,"",pcVar2);
  return;
}

Assistant:

static void la_miam_file_segment_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_file_segment_msg const *msg = data;
	indent++;
	LA_ISPRINTF(vstr, indent, "File ID: %u\n", msg->file_id);
	LA_ISPRINTF(vstr, indent, "Segment ID: %u\n", msg->segment_id);
	LA_ISPRINTF(vstr, indent, "Reassembly: %s\n", la_reasm_status_name_get(msg->reasm_status));
}